

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::MultD(Forth *this)

{
  uint uVar1;
  anon_union_8_2_340ac67b_for_data_ local_20;
  SDCell n2;
  SDCell n1;
  Forth *this_local;
  
  requireDStackDepth(this,2,"M*");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell(&n2,(long)(int)uVar1);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  SDCell::SDCell((SDCell *)&local_20.Cells,(long)(int)uVar1);
  n2.data_ = (anon_union_8_2_340ac67b_for_data_)(local_20.Dcells * (long)n2.data_);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,n2.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,n2.data_.Cells.hi);
  return;
}

Assistant:

void MultD(){
			REQUIRE_DSTACK_DEPTH(2, "M*");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) };
			SDCell n2{ static_cast<SCell>(dStack.getTop(1)) };
			n1.data_.Dcells *= n2.data_.Dcells;
			dStack.setTop(1, n1.data_.Cells.lo);
			dStack.setTop(0, n1.data_.Cells.hi);
		}